

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

DataSegment * __thiscall wabt::Module::GetDataSegment(Module *this,Var *var)

{
  Index IVar1;
  DataSegment *pDVar2;
  
  IVar1 = BindingHash::FindIndex(&this->data_segment_bindings,var);
  if ((ulong)IVar1 < (ulong)(*(long *)&this->field_0x150 - *(long *)&this->data_segments >> 3)) {
    pDVar2 = *(DataSegment **)(*(long *)&this->data_segments + (ulong)IVar1 * 8);
  }
  else {
    pDVar2 = (DataSegment *)0x0;
  }
  return pDVar2;
}

Assistant:

const DataSegment* Module::GetDataSegment(const Var& var) const {
  return const_cast<Module*>(this)->GetDataSegment(var);
}